

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O2

void __thiscall
Catch::BinaryExpr<const_std::optional<unsigned_short>_&,_unsigned_short>::
streamReconstructedExpression
          (BinaryExpr<const_std::optional<unsigned_short>_&,_unsigned_short> *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  optional<unsigned_short> *in_RDX;
  string *in_R9;
  StringRef op;
  enable_if_t<_::Catch::Detail::IsStreamInsertable<unsigned_short>::value,_std::string> local_60;
  string local_40;
  
  StringMaker<std::optional<unsigned_short>,void>::convert_abi_cxx11_
            (&local_40,(StringMaker<std::optional<unsigned_short>,void> *)this->m_lhs,in_RDX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  StringMaker<unsigned_short,_void>::convert<unsigned_short>(&local_60,&this->m_rhs);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }